

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

size_t __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this)

{
  uint uVar1;
  size_t sVar2;
  object *poVar3;
  
  while (uVar1 = (byte)*(object_storage *)this & 0xf, uVar1 - 8 < 2) {
    this = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
            ((long)this + 8);
  }
  if (uVar1 == 0xd) {
    poVar3 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage
             ::value_abi_cxx11_((object_storage *)this);
    sVar2 = ((long)(poVar3->members_).
                   super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(poVar3->members_).
                  super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x30;
  }
  else if (uVar1 == 0xe) {
    sVar2 = *(long *)(*(long *)((long)this + 8) + 0x10) - *(long *)(*(long *)((long)this + 8) + 8)
            >> 4;
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

std::size_t size() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    return cast<array_storage>().value().size();
                case json_storage_kind::empty_object:
                    return 0;
                case json_storage_kind::object:
                    return cast<object_storage>().value().size();
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().size();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().size();
                default:
                    return 0;
            }
        }